

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

void QUtil::pipe_file(char *filename,Pipeline *p)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  runtime_error *this;
  long *plVar3;
  long *plVar4;
  uchar buf [8192];
  long *local_2078;
  long local_2070;
  long local_2068;
  long lStack_2060;
  undefined1 *local_2058 [2];
  undefined1 local_2048 [16];
  undefined1 local_2038 [8200];
  
  __stream = (FILE *)safe_fopen(filename,"rb");
  while( true ) {
    sVar2 = fread(local_2038,1,0x2000,__stream);
    if (sVar2 == 0) break;
    (*p->_vptr_Pipeline[2])(p,local_2038,sVar2);
  }
  (*p->_vptr_Pipeline[3])(p);
  iVar1 = ferror(__stream);
  if (iVar1 == 0) {
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_2058[0] = local_2048;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2058,"failure reading file ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_2058);
  local_2078 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_2078 == plVar4) {
    local_2068 = *plVar4;
    lStack_2060 = plVar3[3];
    local_2078 = &local_2068;
  }
  else {
    local_2068 = *plVar4;
  }
  local_2070 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_2078);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QUtil::pipe_file(char const* filename, Pipeline* p)
{
    // Exercised in test suite by testing file_provider.
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    size_t len = 0;
    int constexpr size = 8192;
    unsigned char buf[size];
    while ((len = fread(buf, 1, size, f)) > 0) {
        p->write(buf, len);
    }
    p->finish();
    if (ferror(f)) {
        throw std::runtime_error(std::string("failure reading file ") + filename);
    }
}